

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O3

void __thiscall
siamese::RecoveryPacketList::Insert
          (RecoveryPacketList *this,RecoveryPacket *recovery,bool outOfOrder)

{
  CheckedRegionState *pCVar1;
  RecoveryMatrixState *pRVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  RecoveryPacket *pRVar6;
  RecoveryPacket **ppRVar7;
  RecoveryPacket *pRVar8;
  RecoveryPacket *pRVar9;
  
  ppRVar7 = &this->Tail;
  if (this->Tail == (RecoveryPacket *)0x0) {
    recovery->Next = (RecoveryPacket *)0x0;
    recovery->Prev = (RecoveryPacket *)0x0;
    this->Head = recovery;
  }
  else {
    pRVar8 = (RecoveryPacket *)0x0;
    pRVar6 = this->Tail;
    do {
      pRVar9 = pRVar6;
      if ((pRVar9->ElementEnd <= recovery->ElementEnd) &&
         ((pRVar9->ElementEnd < recovery->ElementEnd ||
          (((recovery->Metadata).ColumnStart - (pRVar9->Metadata).ColumnStart >> 0x15 & 1) != 0))))
      {
        recovery->Next = pRVar8;
        recovery->Prev = pRVar9;
        pRVar9->Next = recovery;
        if (pRVar8 != (RecoveryPacket *)0x0) goto LAB_0014537f;
        *ppRVar7 = recovery;
        goto LAB_001453cc;
      }
      pRVar8 = pRVar9;
      pRVar6 = pRVar9->Prev;
    } while (pRVar9->Prev != (RecoveryPacket *)0x0);
    recovery->Next = pRVar9;
    recovery->Prev = (RecoveryPacket *)0x0;
    this->Head = recovery;
LAB_0014537f:
    ppRVar7 = &pRVar8->Prev;
  }
  *ppRVar7 = recovery;
  pCVar1 = this->CheckedRegion;
  pCVar1->ElementStart = 0;
  pCVar1->FirstRecovery = (RecoveryPacket *)0x0;
  pCVar1->LastRecovery = (RecoveryPacket *)0x0;
  *(undefined8 *)((long)&pCVar1->LastRecovery + 5) = 0;
  *(undefined8 *)((long)&pCVar1->RecoveryCount + 1) = 0;
  pRVar2 = pCVar1->RecoveryMatrix;
  (pRVar2->Columns).Size = 0;
  (pRVar2->Rows).Size = 0;
  (pRVar2->Pivots).Size = 0;
  (pRVar2->Matrix).Rows = 0;
  (pRVar2->Matrix).Columns = 0;
  pRVar2->PreviousNextCheckStart = 0;
  pRVar2->GEResumePivot = 0;
LAB_001453cc:
  this->RecoveryPacketCount = this->RecoveryPacketCount + 1;
  if (!outOfOrder) {
    uVar3 = (recovery->Metadata).ColumnStart;
    uVar4 = (recovery->Metadata).SumCount;
    uVar5 = (recovery->Metadata).LDPCCount;
    (this->LastRecoveryMetadata).Row = (recovery->Metadata).Row;
    (this->LastRecoveryMetadata).ColumnStart = uVar3;
    (this->LastRecoveryMetadata).SumCount = uVar4;
    (this->LastRecoveryMetadata).LDPCCount = uVar5;
    this->LastRecoveryBytes = (recovery->Buffer).Bytes;
  }
  return;
}

Assistant:

void RecoveryPacketList::Insert(RecoveryPacket* recovery, bool outOfOrder)
{
    RecoveryPacket* prev = Tail;
    RecoveryPacket* next = nullptr;

    const unsigned recoveryStart = recovery->Metadata.ColumnStart;
    const unsigned recoveryEnd   = recovery->ElementEnd;

    // Search for insertion point:
    for (; prev; next = prev, prev = prev->Prev)
    {
        const unsigned prevStart = prev->Metadata.ColumnStart;
        const unsigned prevEnd   = prev->ElementEnd;

        /*
            This insertion order guarantees that the left and right side of
            the recovery input ranges are monotonically increasing as in:

                recovery 0: 012345
                recovery 1:   23456 <- Cauchy row
                recovery 2: 01234567
                recovery 3:     45678
                recovery 4:     456789
        */
        if (recoveryEnd >= prevEnd)
        {
            if (recoveryEnd > prevEnd) {
                break;
            }
            if (IsColumnDeltaNegative(SubtractColumns(recoveryStart, prevStart))) {
                break;
            }
        }
    }

    // Insert into linked list
    recovery->Next = next;
    recovery->Prev = prev;
    if (prev) {
        prev->Next = recovery;
    }
    else {
        Head = recovery;
    }
    if (next) {
        next->Prev = recovery;
    }
    else {
        Tail = recovery;
    }

    // If inserting at head or somewhere in the middle:
    // Invalidate the checked region because a smaller solution may be available
    if (!prev || next) {
        CheckedRegion->Reset();
    }
    // Note that for the case where we insert at the end of a non-empty list we do
    // not reset the checked region.  This is the common case where recovery data is
    // received in order.

    ++RecoveryPacketCount;

    if (!outOfOrder)
    {
        // Update the last received recovery metadata
        LastRecoveryMetadata = recovery->Metadata;
        LastRecoveryBytes = recovery->Buffer.Bytes;
    }
}